

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O0

SubpassAttachmentHandle __thiscall
myvk::RenderPassState::SubpassAttachmentHandle::AddInputAttachment
          (SubpassAttachmentHandle *this,char *attachment_str,VkImageLayout layout,
          char *generator_subpass_str,VkPipelineStageFlags generator_stage,
          VkPipelineStageFlags use_stage,VkAccessFlags generator_access,VkAccessFlags use_access,
          VkDependencyFlags dependency_flag)

{
  reference pvVar1;
  reference pvVar2;
  VkAttachmentReference *pVVar3;
  size_type sVar4;
  undefined4 in_EDX;
  RenderPassState *in_RSI;
  undefined1 (*in_RDI) [12];
  SubpassAttachmentHandle SVar5;
  VkPipelineStageFlags unaff_retaddr;
  VkPipelineStageFlags unaff_retaddr_00;
  uint32_t in_stack_00000008;
  uint32_t in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  VkAccessFlags in_stack_00000020;
  VkDependencyFlags in_stack_00000028;
  value_type *des;
  value_type *info;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffd0;
  VkAccessFlags in_stack_fffffffffffffffc;
  
  pvVar1 = std::
           vector<myvk::RenderPassState::SubpassInfo,_std::allocator<myvk::RenderPassState::SubpassInfo>_>
           ::operator[]((vector<myvk::RenderPassState::SubpassInfo,_std::allocator<myvk::RenderPassState::SubpassInfo>_>
                         *)(*(long *)*in_RDI + 0x78),(ulong)*(uint *)(*in_RDI + 8));
  get_attachment(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
  std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::push_back
            ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (value_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pvVar2 = std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::operator[]
                     ((vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> *)
                      (*(long *)*in_RDI + 0x90),(ulong)*(uint *)(*in_RDI + 8));
  pVVar3 = std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::data
                     ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)
                      0x2cff53);
  pvVar2->pInputAttachments = pVVar3;
  sVar4 = std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::size
                    (&pvVar1->input_attachment_references);
  pvVar2->inputAttachmentCount = (uint32_t)sVar4;
  get_subpass(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
  insert_subpass_dependency
            ((RenderPassState *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_0000000c,
             in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,
             in_stack_00000020,in_stack_00000028);
  SVar5._12_4_ = 0;
  SVar5._0_12_ = *in_RDI;
  return SVar5;
}

Assistant:

RenderPassState::SubpassAttachmentHandle RenderPassState::SubpassAttachmentHandle::AddInputAttachment(
    const char *attachment_str, VkImageLayout layout, const char *generator_subpass_str,
    VkPipelineStageFlags generator_stage, VkPipelineStageFlags use_stage, VkAccessFlags generator_access,
    VkAccessFlags use_access, VkDependencyFlags dependency_flag) {
	auto &info = m_state_ptr->m_subpass_infos[m_subpass];
	info.input_attachment_references.push_back({m_state_ptr->get_attachment(attachment_str), layout});

	auto &des = m_state_ptr->m_subpass_descriptions[m_subpass];
	des.pInputAttachments = info.input_attachment_references.data();
	des.inputAttachmentCount = info.input_attachment_references.size();

	m_state_ptr->insert_subpass_dependency(m_state_ptr->get_subpass(generator_subpass_str), m_subpass, generator_stage,
	                                       use_stage, generator_access, use_access, dependency_flag);
	return *this;
}